

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

string * string_from_abi_cxx11_
                   (string *__return_storage_ptr__,llama_context *ctx,
                   vector<int,_std::allocator<int>_> *tokens)

{
  _Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::__0>
  *p_Var1;
  llama_token *plVar2;
  bool bVar3;
  _Alloc_hider _Var4;
  ostream *poVar5;
  size_type sVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __it;
  size_type sVar7;
  long lVar8;
  _Alloc_hider this;
  _Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::__0>
  *p_Var9;
  _Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::__0>
  *p_Var10;
  llama_token *plVar11;
  _Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::__0>
  *this_00;
  string detokenized;
  string local_1d8;
  stringstream buf;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&buf);
  std::operator<<(local_1a8,"[ ");
  plVar11 = (tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  plVar2 = (tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  bVar3 = true;
  do {
    if (plVar11 == plVar2) {
      std::operator<<(local_1a8," ]");
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)&buf);
      return __return_storage_ptr__;
    }
    if (!bVar3) {
      std::operator<<(local_1a8,", ");
    }
    __it._M_current = (char *)ctx;
    common_token_to_piece_abi_cxx11_(&detokenized,ctx,*plVar11,true);
    sVar7 = detokenized._M_string_length;
    _Var4 = detokenized._M_dataplus;
    p_Var1 = (_Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::__0>
              *)(detokenized._M_dataplus._M_p + detokenized._M_string_length);
    sVar6 = detokenized._M_string_length;
    this = detokenized._M_dataplus;
    for (lVar8 = (long)detokenized._M_string_length >> 2; p_Var10 = p_Var1,
        p_Var9 = (_Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::__0>
                  *)this._M_p, 0 < lVar8; lVar8 = lVar8 + -1) {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::$_0>
              ::operator()((_Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::__0>
                            *)this._M_p,__it);
      if (bVar3) goto LAB_001b84a4;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::$_0>
              ::operator()((_Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::__0>
                            *)this._M_p + 1,__it);
      p_Var9 = (_Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::__0>
                *)this._M_p + 1;
      if (bVar3) goto LAB_001b84a4;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::$_0>
              ::operator()((_Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::__0>
                            *)this._M_p + 2,__it);
      p_Var9 = (_Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::__0>
                *)this._M_p + 2;
      if (bVar3) goto LAB_001b84a4;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::$_0>
              ::operator()((_Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::__0>
                            *)this._M_p + 3,__it);
      p_Var9 = (_Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::__0>
                *)this._M_p + 3;
      if (bVar3) goto LAB_001b84a4;
      this._M_p = this._M_p + 4;
      sVar6 = sVar6 - 4;
    }
    if (sVar6 == 1) {
LAB_001b8489:
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::$_0>
              ::operator()((_Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::__0>
                            *)this._M_p,__it);
      p_Var9 = (_Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::__0>
                *)this._M_p;
      if (!bVar3) {
        p_Var9 = p_Var1;
      }
LAB_001b84a4:
      this_00 = p_Var9;
      if (p_Var9 != p_Var1) {
        while (this_00 = this_00 + 1, _Var4._M_p = detokenized._M_dataplus._M_p,
              sVar7 = detokenized._M_string_length, p_Var10 = p_Var9, this_00 != p_Var1) {
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::$_0>
                  ::operator()(this_00,__it);
          if (!bVar3) {
            *p_Var9 = *this_00;
            p_Var9 = p_Var9 + 1;
          }
        }
      }
    }
    else {
      if (sVar6 == 2) {
LAB_001b847a:
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::$_0>
                ::operator()((_Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::__0>
                              *)this._M_p,__it);
        p_Var9 = (_Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::__0>
                  *)this._M_p;
        if (!bVar3) {
          this._M_p = this._M_p + 1;
          goto LAB_001b8489;
        }
        goto LAB_001b84a4;
      }
      if (sVar6 == 3) {
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::$_0>
                ::operator()((_Iter_pred<string_from[abi:cxx11](llama_context_const*,std::vector<int,std::allocator<int>>const&)::__0>
                              *)this._M_p,__it);
        if (!bVar3) {
          this._M_p = this._M_p + 1;
          goto LAB_001b847a;
        }
        goto LAB_001b84a4;
      }
    }
    std::__cxx11::string::erase(&detokenized,p_Var10,_Var4._M_p + sVar7);
    poVar5 = std::operator<<(local_1a8,"\'");
    poVar5 = std::operator<<(poVar5,(string *)&detokenized);
    poVar5 = std::operator<<(poVar5,"\'");
    poVar5 = std::operator<<(poVar5,":");
    std::__cxx11::to_string(&local_1d8,*plVar11);
    std::operator<<(poVar5,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&detokenized);
    plVar11 = plVar11 + 1;
    bVar3 = false;
  } while( true );
}

Assistant:

std::string string_from(const struct llama_context * ctx, const std::vector<llama_token> & tokens) {
    std::stringstream buf;

    buf << "[ ";

    bool first = true;
    for (const auto & token : tokens) {
        if (!first) {
            buf << ", ";
        } else {
            first = false;
        }

        auto detokenized = common_token_to_piece(ctx, token);

        detokenized.erase(
            std::remove_if(
                detokenized.begin(),
                detokenized.end(),
                [](const unsigned char c) { return !std::isprint(c); }),
            detokenized.end());

        buf << "'" << detokenized << "'"
            << ":" << std::to_string(token);
    }

    buf << " ]";

    return buf.str();
}